

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  bool bVar1;
  int iVar2;
  ImDrawList *pIVar3;
  ImDrawCmd *pIVar4;
  ImDrawVert *pIVar5;
  undefined8 in_RDX;
  ImDrawList *in_RSI;
  ImGuiWindow *in_RDI;
  float fVar6;
  ImDrawListFlags backup_flags;
  ImDrawVert *v;
  int n_1;
  ImVec2 triangle_1 [3];
  char *buf_end;
  char *buf_p;
  int idx_i;
  int prim;
  ImGuiListClipper clipper;
  int n;
  ImVec2 triangle [3];
  uint base_idx;
  float total_area;
  bool pcmd_node_open;
  char buf [300];
  uint *idx_buffer;
  ImDrawCmd *pcmd;
  uint elem_offset;
  ImDrawList *fg_draw_list;
  bool node_open;
  float items_height;
  int in_stack_fffffffffffffcdc;
  float in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  char *local_310;
  ImGuiListClipper *in_stack_fffffffffffffcf8;
  ImVec2 *local_2d0;
  undefined8 in_stack_fffffffffffffd60;
  ImVec2 *pIVar7;
  undefined8 in_stack_fffffffffffffd68;
  ImVec2 *this;
  ImVec2 *in_stack_fffffffffffffd70;
  ImDrawCmd *pIVar8;
  ImVec2 *in_stack_fffffffffffffd78;
  ImDrawList *in_stack_fffffffffffffd80;
  ImDrawList *size_arg;
  char *pcVar9;
  undefined1 in_stack_fffffffffffffdba;
  undefined1 in_stack_fffffffffffffdbb;
  ImDrawListFlags in_stack_fffffffffffffdbc;
  ImVec2 in_stack_fffffffffffffdc0;
  ImDrawList *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  ImVec2 local_228 [4];
  undefined1 *local_208;
  ImGuiListClipper *local_200;
  uint local_1f4;
  int local_1f0;
  int local_1dc;
  int local_1d8;
  ImVec2 local_1c4;
  int local_1bc;
  ImVec2 local_1b8 [4];
  uint local_194;
  float local_190;
  byte local_189;
  ImGuiListClipper local_188 [12];
  undefined1 auStack_5c [4];
  uint *local_58;
  ImDrawCmd *local_50;
  uint local_44;
  ImVec2 local_40;
  ImDrawList *local_38;
  ImVec4 local_2c;
  byte local_19;
  ImDrawList *local_10;
  ImGuiWindow *local_8;
  
  if (in_RSI->_OwnerName == (char *)0x0) {
    pcVar9 = "";
  }
  else {
    pcVar9 = in_RSI->_OwnerName;
  }
  items_height = (float)(in_RSI->CmdBuffer).Size;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_19 = TreeNode(in_RSI,"%s: \'%s\' %d vtx, %d indices, %d cmds",in_RDX,pcVar9,
                      (ulong)(uint)(in_RSI->VtxBuffer).Size,(ulong)(uint)(in_RSI->IdxBuffer).Size);
  size_arg = local_10;
  pIVar3 = GetWindowDrawList();
  if (size_arg == pIVar3) {
    SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
    ImVec4::ImVec4(&local_2c,1.0,0.4,0.4,1.0);
    TextColored(&local_2c,"CURRENTLY APPENDING");
    if ((local_19 & 1) != 0) {
      TreePop();
    }
  }
  else {
    local_38 = GetForegroundDrawList(local_8);
    if ((local_8 != (ImGuiWindow *)0x0) &&
       (bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0), bVar1)) {
      local_40 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffcdc,items_height),
                           (ImVec2 *)0x191be8);
      ImDrawList::AddRect(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                          in_stack_fffffffffffffd70,
                          (ImU32)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                          (float)in_stack_fffffffffffffd68,
                          (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                          (float)in_stack_fffffffffffffd60);
    }
    if ((local_19 & 1) != 0) {
      if ((local_8 != (ImGuiWindow *)0x0) && ((local_8->WasActive & 1U) == 0)) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
      local_44 = 0;
      local_50 = ImVector<ImDrawCmd>::begin(&local_10->CmdBuffer);
      while (pIVar8 = local_50, pIVar4 = ImVector<ImDrawCmd>::end(&local_10->CmdBuffer),
            pIVar8 < pIVar4) {
        if ((local_50->UserCallback != (ImDrawCallback)0x0) || (local_50->ElemCount != 0)) {
          if (local_50->UserCallback == (ImDrawCallback)0x0) {
            if ((local_10->IdxBuffer).Size < 1) {
              local_58 = (uint *)0x0;
            }
            else {
              local_58 = (local_10->IdxBuffer).Data;
            }
            ImFormatString((char *)(double)(local_50->ClipRect).x,
                           (size_t)(double)(local_50->ClipRect).y,
                           (char *)(double)(local_50->ClipRect).z,(double)(local_50->ClipRect).w,
                           local_188,300,
                           "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           (ulong)local_50->ElemCount / 3,local_50->TextureId);
            pIVar8 = local_50;
            pIVar4 = ImVector<ImDrawCmd>::begin(&local_10->CmdBuffer);
            local_189 = TreeNode((void *)(((long)pIVar8 - (long)pIVar4) / 0x38),"%s",local_188);
            bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
            if ((bVar1) &&
               ((((show_drawcmd_mesh & 1U) != 0 || ((show_drawcmd_aabb & 1U) != 0)) &&
                (local_38 != (ImDrawList *)0x0)))) {
              NodeDrawCmdShowMeshAndBoundingBox
                        ((ImGuiWindow *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         in_stack_fffffffffffffdc8,(ImDrawCmd *)in_stack_fffffffffffffdc0,
                         in_stack_fffffffffffffdbc,(bool)in_stack_fffffffffffffdbb,
                         (bool)in_stack_fffffffffffffdba);
            }
            if ((local_189 & 1) != 0) {
              local_190 = 0.0;
              for (local_194 = local_44; local_194 < local_44 + local_50->ElemCount;
                  local_194 = local_194 + 3) {
                this = local_1b8;
                pIVar7 = local_1b8 + 3;
                do {
                  ImVec2::ImVec2(this);
                  this = this + 1;
                } while (this != pIVar7);
                for (local_1bc = 0; local_1bc < 3; local_1bc = local_1bc + 1) {
                  pIVar5 = ImVector<ImDrawVert>::operator[]
                                     ((ImVector<ImDrawVert> *)
                                      CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                      in_stack_fffffffffffffcdc);
                  local_1b8[local_1bc] = pIVar5->pos;
                }
                fVar6 = ImTriangleArea(local_1b8,local_1b8 + 1,local_1b8 + 2);
                local_190 = fVar6 + local_190;
              }
              ImFormatString((char *)(double)local_190,(size_t)local_188,(char *)0x12c,
                             "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                             (ulong)local_50->ElemCount,(ulong)local_50->VtxOffset,
                             (ulong)local_50->IdxOffset);
              ImVec2::ImVec2(&local_1c4,0.0,0.0);
              Selectable((char *)in_RSI,SUB81((ulong)pcVar9 >> 0x38,0),(ImGuiSelectableFlags)pcVar9,
                         (ImVec2 *)size_arg);
              bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
              if ((bVar1) && (local_38 != (ImDrawList *)0x0)) {
                NodeDrawCmdShowMeshAndBoundingBox
                          ((ImGuiWindow *)
                           CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                           in_stack_fffffffffffffdc8,(ImDrawCmd *)in_stack_fffffffffffffdc0,
                           in_stack_fffffffffffffdbc,(bool)in_stack_fffffffffffffdbb,
                           (bool)in_stack_fffffffffffffdba);
              }
              ImGuiListClipper::ImGuiListClipper
                        ((ImGuiListClipper *)
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                         in_stack_fffffffffffffcdc,items_height);
              while (bVar1 = ImGuiListClipper::Step(in_stack_fffffffffffffcf8), bVar1) {
                local_1f4 = local_44 + local_1dc * 3;
                for (local_1f0 = local_1dc; local_1f0 < local_1d8; local_1f0 = local_1f0 + 1) {
                  local_200 = local_188;
                  local_208 = auStack_5c;
                  local_2d0 = local_228;
                  do {
                    ImVec2::ImVec2(local_2d0);
                    local_2d0 = local_2d0 + 1;
                  } while (local_2d0 != local_228 + 3);
                  for (in_stack_fffffffffffffdd4 = 0; in_stack_fffffffffffffdd4 < 3;
                      in_stack_fffffffffffffdd4 = in_stack_fffffffffffffdd4 + 1) {
                    in_stack_fffffffffffffdc8 =
                         (ImDrawList *)
                         ImVector<ImDrawVert>::operator[]
                                   ((ImVector<ImDrawVert> *)
                                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                    in_stack_fffffffffffffcdc);
                    iVar2 = (in_stack_fffffffffffffdc8->CmdBuffer).Capacity;
                    local_228[in_stack_fffffffffffffdd4].x =
                         (float)(in_stack_fffffffffffffdc8->CmdBuffer).Size;
                    local_228[in_stack_fffffffffffffdd4].y = (float)iVar2;
                    if (in_stack_fffffffffffffdd4 == 0) {
                      local_310 = "Vert:";
                    }
                    else {
                      local_310 = "     ";
                    }
                    in_stack_fffffffffffffcf8 = local_200;
                    iVar2 = ImFormatString((char *)(double)(float)(in_stack_fffffffffffffdc8->
                                                                  CmdBuffer).Size,
                                           (size_t)(double)(float)(in_stack_fffffffffffffdc8->
                                                                  CmdBuffer).Capacity,
                                           (char *)(double)((ImVec2 *)
                                                           &(in_stack_fffffffffffffdc8->CmdBuffer).
                                                            Data)->x,
                                           (double)((ImVec2 *)
                                                   &(in_stack_fffffffffffffdc8->CmdBuffer).Data)->y,
                                           local_200,(long)local_208 - (long)local_200,
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           local_310,(ulong)local_1f4,
                                           (ulong)(uint)(in_stack_fffffffffffffdc8->IdxBuffer).Size)
                    ;
                    local_200 = (ImGuiListClipper *)((long)&local_200->DisplayStart + (long)iVar2);
                    local_1f4 = local_1f4 + 1;
                  }
                  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdc0,0.0,0.0);
                  Selectable((char *)in_RSI,SUB81((ulong)pcVar9 >> 0x38,0),
                             (ImGuiSelectableFlags)pcVar9,(ImVec2 *)size_arg);
                  if (local_38 != (ImDrawList *)0x0) {
                    bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
                    in_stack_fffffffffffffce4 =
                         (float)CONCAT13(bVar1,SUB43(in_stack_fffffffffffffce4,0));
                    if (bVar1) {
                      in_stack_fffffffffffffdbc = local_38->Flags;
                      local_38->Flags = local_38->Flags & 0xfffffffe;
                      ImDrawList::AddPolyline(local_38,local_228,3,0xff00ffff,true,1.0);
                      local_38->Flags = in_stack_fffffffffffffdbc;
                    }
                  }
                }
              }
              TreePop();
              ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)0x19246f);
            }
          }
          else {
            BulletText("Callback %p, user_data %p",local_50->UserCallback,local_50->UserCallbackData
                      );
          }
        }
        local_44 = local_50->ElemCount + local_44;
        local_50 = local_50 + 1;
      }
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }